

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_date.cpp
# Opt level: O2

string * __thiscall
pstore::http::http_date_abi_cxx11_(string *__return_storage_ptr__,http *this,time_t time)

{
  char *pcVar1;
  char *pcVar2;
  ostream *poVar3;
  uint uVar4;
  ulong uVar5;
  tm t;
  ostringstream fixdate;
  
  gm_time(&t,(time_t)this);
  if (t.tm_wday < 1) {
    t.tm_wday = 0;
  }
  uVar5 = 6;
  if (t.tm_wday < 6) {
    uVar5 = (ulong)(uint)t.tm_wday;
  }
  pcVar1 = http_date::days._M_elems[uVar5];
  uVar4 = 0;
  if (0 < t.tm_mon) {
    uVar4 = t.tm_mon;
  }
  uVar5 = 0xb;
  if ((int)uVar4 < 0xb) {
    uVar5 = (ulong)uVar4;
  }
  pcVar2 = http_date::months._M_elems[uVar5];
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fixdate);
  poVar3 = std::operator<<((ostringstream *)&fixdate,0x30);
  poVar3 = std::operator<<(poVar3,pcVar1);
  poVar3 = std::operator<<(poVar3,", ");
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 2;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,t.tm_mday);
  poVar3 = std::operator<<(poVar3,' ');
  poVar3 = std::operator<<(poVar3,pcVar2);
  poVar3 = std::operator<<(poVar3,' ');
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 4;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,t.tm_year + 0x76c);
  poVar3 = std::operator<<(poVar3,' ');
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 2;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,t.tm_hour);
  poVar3 = std::operator<<(poVar3,':');
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 2;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,t.tm_min);
  poVar3 = std::operator<<(poVar3,':');
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 2;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,t.tm_sec);
  std::operator<<(poVar3," GMT");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fixdate);
  return __return_storage_ptr__;
}

Assistant:

std::string http_date (time_t const time) {
            std::tm const t = gm_time (time);

            // day-name = %x4D.6F.6E ; "Mon", case-sensitive
            //          / %x54.75.65 ; "Tue", case-sensitive
            //          / %x57.65.64 ; "Wed", case-sensitive
            //          / %x54.68.75 ; "Thu", case-sensitive
            //          / %x46.72.69 ; "Fri", case-sensitive
            //          / %x53.61.74 ; "Sat", case-sensitive
            //          / %x53.75.6E ; "Sun", case-sensitive
            static constexpr std::array<char const *, 7> days{
                {"Sun", "Mon", "Tue", "Wed", "Thu", "Fri", "Sat"}};
            auto const day_name = days[as_index (t.tm_wday, days.size ())];

            // month = %x4A.61.6E ; "Jan", case-sensitive
            //       / %x46.65.62 ; "Feb", case-sensitive
            //       / %x4D.61.72 ; "Mar", case-sensitive
            //       / %x41.70.72 ; "Apr", case-sensitive
            //       / %x4D.61.79 ; "May", case-sensitive
            //       / %x4A.75.6E ; "Jun", case-sensitive
            //       / %x4A.75.6C ; "Jul", case-sensitive
            //       / %x41.75.67 ; "Aug", case-sensitive
            //       / %x53.65.70 ; "Sep", case-sensitive
            //       / %x4F.63.74 ; "Oct", case-sensitive
            //       / %x4E.6F.76 ; "Nov", case-sensitive
            //       / %x44.65.63 ; "Dec", case-sensitive
            static constexpr std::array<char const *, 12> months{{"Jan", "Feb", "Mar", "Apr", "May",
                                                                  "Jun", "Jul", "Aug", "Sep", "Oct",
                                                                  "Nov", "Dec"}};
            auto const month = months[as_index (t.tm_mon, months.size ())];

            // hour         = 2DIGIT
            // minute       = 2DIGIT
            // second       = 2DIGIT
            // time-of-day  = hour ":" minute ":" second
            //              ; 00:00:00 - 23:59:60 (leap second)
            // year         = 4DIGIT
            // day          = 2DIGIT
            // date1        = day SP month SP year
            //              ; e.g., 02 Jun 1982
            // IMF-fixdate  = day-name "," SP date1 SP time-of-day SP GMT
            std::ostringstream fixdate;
            fixdate << std::setfill ('0') << day_name << ", " << std::setw (2) << t.tm_mday << ' '
                    << month << ' ' << std::setw (4) << t.tm_year + 1900 << ' ' << std::setw (2)
                    << t.tm_hour << ':' << std::setw (2) << t.tm_min << ':' << std::setw (2)
                    << t.tm_sec << " GMT";
            return fixdate.str ();
        }